

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

ResultCode __thiscall kpeg::JPEGDecoder::decodeImageFile(JPEGDecoder *this)

{
  ifstream *piVar1;
  char cVar2;
  Level LVar3;
  ResultCode RVar4;
  Logger *pLVar5;
  ostream *poVar6;
  long *plVar7;
  istream *piVar8;
  long *plVar9;
  Level lvl;
  Level lvl_00;
  Level lvl_01;
  Level lvl_02;
  Level lvl_03;
  Level lvl_04;
  ResultCode RVar10;
  UInt8 byte;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar2 = std::__basic_file<char>::is_open();
  if ((cVar2 == '\0') ||
     (piVar1 = &this->m_imageFile,
     *(int *)(&this->field_0x40 + *(long *)(*(long *)piVar1 + -0x18)) != 0)) {
    pLVar5 = Logger::get();
    LVar3 = Logger::getLevel(pLVar5);
    RVar10 = ERROR;
    if ((int)LVar3 < 0) {
      return ERROR;
    }
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x0,lvl);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Decoder.cpp",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
    std::operator+(&local_40,"Unable scan image file: \'",&this->m_filename);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
    plVar9 = plVar7 + 2;
    if ((long *)*plVar7 == plVar9) {
      local_50 = *plVar9;
      lStack_48 = plVar7[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar9;
      local_60 = (long *)*plVar7;
    }
    local_58 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_60,local_58);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pLVar5 = Logger::get();
    LVar3 = Logger::getLevel(pLVar5);
    if (0 < (int)LVar3) {
      pLVar5 = Logger::get();
      poVar6 = Logger::getStream(pLVar5);
      Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x1,lvl_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Decoder.cpp",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x62);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Started decoding process...",0x1b);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    RVar10 = DECODE_DONE;
    do {
      *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) =
           *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) &
           0xffffefff;
      piVar8 = std::operator>>((istream *)piVar1,(char *)&local_60);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) goto LAB_0012a830;
      if ((UInt8)local_60 != -1) {
        pLVar5 = Logger::get();
        LVar3 = Logger::getLevel(pLVar5);
        RVar10 = ERROR;
        if (-1 < (int)LVar3) {
          pLVar5 = Logger::get();
          poVar6 = Logger::getStream(pLVar5);
          Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x0,lvl_01);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_80._M_dataplus._M_p,local_80._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Decoder.cpp",0xb);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
          *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x81);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"[ FATAL ] Invalid JFIF file! Terminating...",0x2b);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_0012a830;
      }
      *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) =
           *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) &
           0xffffefff;
      std::operator>>((istream *)piVar1,(char *)&local_60);
      RVar4 = parseSegmentInfo(this,(UInt8)local_60);
    } while (RVar4 != TERMINATE);
    RVar10 = TERMINATE;
LAB_0012a830:
    if (RVar10 == TERMINATE) {
      pLVar5 = Logger::get();
      LVar3 = Logger::getLevel(pLVar5);
      if ((int)LVar3 < 1) {
        return TERMINATE;
      }
      pLVar5 = Logger::get();
      poVar6 = Logger::getStream(pLVar5);
      Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x1,lvl_04);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Decoder.cpp",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Terminated decoding process [NOT-OK].",0x25);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else if (RVar10 == DECODE_INCOMPLETE) {
      pLVar5 = Logger::get();
      LVar3 = Logger::getLevel(pLVar5);
      if ((int)LVar3 < 1) {
        return DECODE_INCOMPLETE;
      }
      pLVar5 = Logger::get();
      poVar6 = Logger::getStream(pLVar5);
      Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x1,lvl_03);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Decoder.cpp",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x94);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Decoding process incomplete [NOT-OK].",0x25);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      if (RVar10 != DECODE_DONE) {
        return RVar10;
      }
      decodeScanData(this);
      Image::createImageFromMCUs(&this->m_image,&this->m_MCU);
      pLVar5 = Logger::get();
      LVar3 = Logger::getLevel(pLVar5);
      if ((int)LVar3 < 1) {
        return DECODE_DONE;
      }
      pLVar5 = Logger::get();
      poVar6 = Logger::getStream(pLVar5);
      Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x1,lvl_02);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Decoder.cpp",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Finished decoding process [OK].",0x1f);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return RVar10;
}

Assistant:

JPEGDecoder::ResultCode JPEGDecoder::decodeImageFile()
    {
        if ( !m_imageFile.is_open() || !m_imageFile.good() )
        {
            LOG(Logger::Level::ERROR) << "Unable scan image file: \'" + m_filename + "\'" << std::endl;
            return ResultCode::ERROR;
        }
        
        LOG(Logger::Level::INFO) << "Started decoding process..." << std::endl;
        
        UInt8 byte;
        ResultCode status = ResultCode::DECODE_DONE;
        
        // TODO: Fix this spaghetti code for keeping track of decode status
        
        while ( m_imageFile >> std::noskipws >> byte )
        {
            if ( byte == JFIF_BYTE_FF )
            {
                m_imageFile >> std::noskipws >> byte;
                
                ResultCode code = parseSegmentInfo(byte);
                
                if ( code == ResultCode::SUCCESS )
                    continue;
                else if ( code == ResultCode::TERMINATE )
                {
                    status = ResultCode::TERMINATE;
                    break;
                }
                else if ( code == ResultCode::DECODE_INCOMPLETE )
                {
                    status = ResultCode::DECODE_INCOMPLETE;
                    break;
                }
            }
            else
            {
                //std::cout <<m_imageFile.tellg() << "ZZZZZZ: " << std::hex << byte << std::endl;
                LOG(Logger::Level::ERROR) << "[ FATAL ] Invalid JFIF file! Terminating..." << std::endl;
                status = ResultCode::ERROR;
                break;
            }
        }
        
        if ( status == ResultCode::DECODE_DONE )
        {
            decodeScanData();
            m_image.createImageFromMCUs( m_MCU );
            LOG(Logger::Level::INFO) << "Finished decoding process [OK]." << std::endl;
        }
        else if ( status == ResultCode::TERMINATE )
        {
            LOG(Logger::Level::INFO) << "Terminated decoding process [NOT-OK]." << std::endl;
        }
        
        else if ( status == ResultCode::DECODE_INCOMPLETE )
        {
            LOG(Logger::Level::INFO) << "Decoding process incomplete [NOT-OK]." << std::endl;
        }
        
        return status;
    }